

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O0

STRING_HANDLE construct_sas_token(char *key,char *scope,char *keyname,uint64_t expiry)

{
  int iVar1;
  HMACSHA256_RESULT HVar2;
  BUFFER_HANDLE handle;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE hash_00;
  size_t payloadLen;
  uchar *payload;
  size_t keyLen;
  uchar *key_00;
  LOGGER_LOG l_4;
  uchar *outBuf;
  size_t outLen;
  uchar *inBuf;
  size_t inLen;
  STRING_HANDLE urlEncodedSignature;
  STRING_HANDLE base64Signature;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  BUFFER_HANDLE hash;
  STRING_HANDLE toBeHashed;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER_HANDLE decodedKey;
  char tokenExpirationTime [32];
  STRING_HANDLE local_30;
  STRING_HANDLE result;
  uint64_t expiry_local;
  char *keyname_local;
  char *scope_local;
  char *key_local;
  
  memset(&decodedKey,0,0x20);
  handle = Azure_Base64_Decode(key);
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                ,"construct_sas_token",0xde,1,"Unable to decode the key for generating the SAS.");
    }
    local_30 = (STRING_HANDLE)0x0;
  }
  else {
    iVar1 = uint64_tToString((char *)&decodedKey,0x20,expiry);
    if (iVar1 == 0) {
      hash = (BUFFER_HANDLE)0x0;
      hash_00 = BUFFER_new();
      if (((hash_00 == (BUFFER_HANDLE)0x0) ||
          (hash = (BUFFER_HANDLE)STRING_new(), hash == (BUFFER_HANDLE)0x0)) ||
         (local_30 = STRING_new(), local_30 == (STRING_HANDLE)0x0)) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                    ,"construct_sas_token",0xf1,1,"Unable to allocate memory to prepare SAS token.")
          ;
        }
        local_30 = (STRING_HANDLE)0x0;
      }
      else {
        iVar1 = STRING_concat((STRING_HANDLE)hash,scope);
        if (((iVar1 == 0) && (iVar1 = STRING_concat((STRING_HANDLE)hash,"\n"), iVar1 == 0)) &&
           (iVar1 = STRING_concat((STRING_HANDLE)hash,(char *)&decodedKey), iVar1 == 0)) {
          urlEncodedSignature = (STRING_HANDLE)0x0;
          inLen = 0;
          payloadLen = STRING_length((STRING_HANDLE)hash);
          payload = (uchar *)STRING_c_str((STRING_HANDLE)hash);
          keyLen = BUFFER_length(handle);
          key_00 = BUFFER_u_char(handle);
          HVar2 = HMACSHA256_ComputeHash(key_00,keyLen,payload,payloadLen,hash_00);
          if ((((HVar2 != HMACSHA256_OK) ||
               (urlEncodedSignature = Azure_Base64_Encode(hash_00),
               urlEncodedSignature == (STRING_HANDLE)0x0)) ||
              ((((inLen = (size_t)URL_Encode(urlEncodedSignature),
                 (STRING_HANDLE)inLen == (STRING_HANDLE)0x0 ||
                 ((((iVar1 = STRING_copy(local_30,"SharedAccessSignature sr="), iVar1 != 0 ||
                    (iVar1 = STRING_concat(local_30,scope), iVar1 != 0)) ||
                   (iVar1 = STRING_concat(local_30,"&sig="), iVar1 != 0)) ||
                  ((iVar1 = STRING_concat_with_STRING(local_30,(STRING_HANDLE)inLen), iVar1 != 0 ||
                   (iVar1 = STRING_concat(local_30,"&se="), iVar1 != 0)))))) ||
                (iVar1 = STRING_concat(local_30,(char *)&decodedKey), iVar1 != 0)) ||
               ((keyname != (char *)0x0 && (iVar1 = STRING_concat(local_30,"&skn="), iVar1 != 0)))))
              ) || ((keyname != (char *)0x0 && (iVar1 = STRING_concat(local_30,keyname), iVar1 != 0)
                    ))) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                        ,"construct_sas_token",0x122,1,"Unable to build the SAS token.");
            }
            STRING_delete(local_30);
            local_30 = (STRING_HANDLE)0x0;
          }
          STRING_delete(urlEncodedSignature);
          STRING_delete((STRING_HANDLE)inLen);
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                      ,"construct_sas_token",0xfd,1,
                      "Unable to build the input to the HMAC to prepare SAS token.");
          }
          STRING_delete(local_30);
          local_30 = (STRING_HANDLE)0x0;
        }
      }
      STRING_delete((STRING_HANDLE)hash);
      BUFFER_delete(hash_00);
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
                  ,"construct_sas_token",0xe6,1,
                  "For some reason converting seconds to a string failed.  No SAS can be generated."
                 );
      }
      local_30 = (STRING_HANDLE)0x0;
    }
    BUFFER_delete(handle);
  }
  return local_30;
}

Assistant:

static STRING_HANDLE construct_sas_token(const char* key, const char* scope, const char* keyname, uint64_t expiry)
{
    STRING_HANDLE result;

    char tokenExpirationTime[32] = { 0 };

    BUFFER_HANDLE decodedKey;

    /*Codes_SRS_SASTOKEN_06_029: [The key parameter is decoded from base64.]*/
    if ((decodedKey = Azure_Base64_Decode(key)) == NULL)
    {
        /*Codes_SRS_SASTOKEN_06_030: [If there is an error in the decoding then SASToken_Create shall return NULL.]*/
        LogError("Unable to decode the key for generating the SAS.");
        result = NULL;
    }
    else
    {
        /*Codes_SRS_SASTOKEN_06_026: [If the conversion to string form fails for any reason then SASToken_Create shall return NULL.]*/
        if (uint64_tToString(tokenExpirationTime, sizeof(tokenExpirationTime), expiry) != 0)
        {
            LogError("For some reason converting seconds to a string failed.  No SAS can be generated.");
            result = NULL;
        }
        else
        {
            STRING_HANDLE toBeHashed = NULL;
            BUFFER_HANDLE hash = NULL;
            if (((hash = BUFFER_new()) == NULL) ||
                ((toBeHashed = STRING_new()) == NULL) ||
                ((result = STRING_new()) == NULL))
            {
                LogError("Unable to allocate memory to prepare SAS token.");
                result = NULL;
            }
            else
            {
                /*Codes_SRS_SASTOKEN_06_009: [The scope is the basis for creating a STRING_HANDLE.]*/
                /*Codes_SRS_SASTOKEN_06_010: [A "\n" is appended to that string.]*/
                /*Codes_SRS_SASTOKEN_06_011: [tokenExpirationTime is appended to that string.]*/
                if ((STRING_concat(toBeHashed, scope) != 0) ||
                    (STRING_concat(toBeHashed, "\n") != 0) ||
                    (STRING_concat(toBeHashed, tokenExpirationTime) != 0))
                {
                    LogError("Unable to build the input to the HMAC to prepare SAS token.");
                    STRING_delete(result);
                    result = NULL;
                }
                else
                {
                    STRING_HANDLE base64Signature = NULL;
                    STRING_HANDLE urlEncodedSignature = NULL;
                    size_t inLen = STRING_length(toBeHashed);
                    const unsigned char* inBuf = (const unsigned char*)STRING_c_str(toBeHashed);
                    size_t outLen = BUFFER_length(decodedKey);
                    unsigned char* outBuf = BUFFER_u_char(decodedKey);
                    /*Codes_SRS_SASTOKEN_06_013: [If an error is returned from the HMAC256 function then NULL is returned from SASToken_Create.]*/
                    /*Codes_SRS_SASTOKEN_06_012: [An HMAC256 hash is calculated using the decodedKey, over toBeHashed.]*/
                    /*Codes_SRS_SASTOKEN_06_014: [If there are any errors from the following operations then NULL shall be returned.]*/
                    /*Codes_SRS_SASTOKEN_06_015: [The hash is base 64 encoded.]*/
                    /*Codes_SRS_SASTOKEN_06_028: [base64Signature shall be url encoded.]*/
                    /*Codes_SRS_SASTOKEN_06_016: [The string "SharedAccessSignature sr=" is the first part of the result of SASToken_Create.]*/
                    /*Codes_SRS_SASTOKEN_06_017: [The scope parameter is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_018: [The string "&sig=" is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_019: [The string urlEncodedSignature shall be appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_020: [The string "&se=" shall be appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_021: [tokenExpirationTime is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_022: [If keyName is non-NULL, the string "&skn=" is appended to result.]*/
                    /*Codes_SRS_SASTOKEN_06_023: [If keyName is non-NULL, the argument keyName is appended to result.]*/
                    if ((HMACSHA256_ComputeHash(outBuf, outLen, inBuf, inLen, hash) != HMACSHA256_OK) ||
                        ((base64Signature = Azure_Base64_Encode(hash)) == NULL) ||
                        ((urlEncodedSignature = URL_Encode(base64Signature)) == NULL) ||
                        (STRING_copy(result, "SharedAccessSignature sr=") != 0) ||
                        (STRING_concat(result, scope) != 0) ||
                        (STRING_concat(result, "&sig=") != 0) ||
                        (STRING_concat_with_STRING(result, urlEncodedSignature) != 0) ||
                        (STRING_concat(result, "&se=") != 0) ||
                        (STRING_concat(result, tokenExpirationTime) != 0) ||
                        ((keyname != NULL) && (STRING_concat(result, "&skn=") != 0)) ||
                        ((keyname != NULL) && (STRING_concat(result, keyname) != 0)))
                    {
                        LogError("Unable to build the SAS token.");
                        STRING_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        /* everything OK */
                    }
                    STRING_delete(base64Signature);
                    STRING_delete(urlEncodedSignature);
                }
            }
            STRING_delete(toBeHashed);
            BUFFER_delete(hash);
        }
        BUFFER_delete(decodedKey);
    }
    return result;
}